

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

int __thiscall
IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar,double weight,double revPot)

{
  double reversal;
  double weight_00;
  int iVar1;
  VoltageDependance *this_00;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  double local_28;
  double revPot_local;
  double weight_local;
  StochasticVariable *stochvar_local;
  IfNeuron *this_local;
  
  local_28 = revPot;
  revPot_local = weight;
  weight_local = (double)stochvar;
  stochvar_local = (StochasticVariable *)this;
  this_00 = (VoltageDependance *)operator_new(0x160);
  weight_00 = revPot_local;
  reversal = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"channel",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Weighted Difference",&local_81);
  VoltageDependance::VoltageDependance(this_00,weight_00,reversal,&local_48,&local_80);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,
                     (StochasticVariable *)weight_local);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar, double weight, double revPot )
{
	return ifneuronMembrane.addTerm( new VoltageDependance(weight, revPot, "channel"), stochvar );
}